

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

GLboolean parseVersionString(int *api,int *major,int *minor,int *rev)

{
  int iVar1;
  _GLFWwindow *p_Var2;
  size_t __n;
  size_t length;
  char *prefixes [4];
  char *version;
  _GLFWwindow *window;
  int i;
  int *rev_local;
  int *minor_local;
  int *major_local;
  int *api_local;
  
  prefixes[0] = "OpenGL ES-CL ";
  prefixes[1] = "OpenGL ES ";
  prefixes[2] = (char *)0x0;
  *api = 0x30001;
  p_Var2 = _glfwPlatformGetCurrentContext();
  prefixes[3] = (char *)(*p_Var2->GetString)(0x1f02);
  if ((GLubyte *)prefixes[3] == (GLubyte *)0x0) {
    _glfwInputError(0x10008,"Failed to retrieve context version string");
    api_local._7_1_ = '\0';
  }
  else {
    window._4_4_ = 0;
    while (prefixes[(long)window._4_4_ + -1] != (char *)0x0) {
      __n = strlen(prefixes[(long)window._4_4_ + -1]);
      iVar1 = strncmp(prefixes[3],prefixes[(long)window._4_4_ + -1],__n);
      if (iVar1 == 0) {
        prefixes[3] = prefixes[3] + __n;
        *api = 0x30002;
        break;
      }
      window._4_4_ = window._4_4_ + 1;
    }
    iVar1 = __isoc99_sscanf(prefixes[3],"%d.%d.%d",major,minor,rev);
    if (iVar1 == 0) {
      _glfwInputError(0x10008,"No version found in context version string");
      api_local._7_1_ = '\0';
    }
    else {
      api_local._7_1_ = '\x01';
    }
  }
  return api_local._7_1_;
}

Assistant:

static GLboolean parseVersionString(int* api, int* major, int* minor, int* rev)
{
    int i;
    _GLFWwindow* window;
    const char* version;
    const char* prefixes[] =
    {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        NULL
    };

    *api = GLFW_OPENGL_API;

    window = _glfwPlatformGetCurrentContext();

    version = (const char*) window->GetString(GL_VERSION);
    if (!version)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Failed to retrieve context version string");
        return GL_FALSE;
    }

    for (i = 0;  prefixes[i];  i++)
    {
        const size_t length = strlen(prefixes[i]);

        if (strncmp(version, prefixes[i], length) == 0)
        {
            version += length;
            *api = GLFW_OPENGL_ES_API;
            break;
        }
    }

    if (!sscanf(version, "%d.%d.%d", major, minor, rev))
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "No version found in context version string");
        return GL_FALSE;
    }

    return GL_TRUE;
}